

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O3

vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *
cfd::core::ScriptUtil::ExtractPubkeysFromMultisigScript
          (vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *__return_storage_ptr__,
          Script *multisig_script,uint32_t *require_num)

{
  undefined4 uVar1;
  uint32_t *puVar2;
  long lVar3;
  undefined4 uVar4;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *pvVar5;
  pointer __dest;
  CfdException *pCVar6;
  const_iterator *pcVar7;
  const_iterator *pcVar8;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *pvVar9;
  size_t __n;
  long lVar10;
  ulong uVar11;
  ScriptElement require_num_element;
  IteratorWrapper<cfd::core::ScriptElement> itr;
  int64_t contain_pubkey_num;
  ScriptElement element;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> elements;
  ScriptElementType local_24c;
  ByteData local_248;
  undefined1 local_228 [64];
  pointer local_1e8;
  pointer local_1e0;
  long local_1d0;
  undefined1 local_1c8 [96];
  CfdSourceLocation local_168;
  IteratorWrapper<cfd::core::ScriptElement> local_150;
  uint32_t *local_f8;
  long local_f0;
  long local_e8;
  string local_e0;
  undefined1 local_c0 [88];
  long local_68;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> local_60;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> local_48;
  
  (__return_storage_ptr__->super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::vector
            (&local_48,&multisig_script->script_stack_);
  ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::vector
            (&local_60,&local_48);
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e0,"Invalid script element access","");
  IteratorWrapper<cfd::core::ScriptElement>::IteratorWrapper(&local_150,&local_60,&local_e0,true);
  local_f8 = require_num;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
            (&local_60);
  pvVar9 = (vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
           &local_150.vector_.
            super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  pvVar5 = pvVar9;
  if (local_150.reverse_ != false) {
    pvVar5 = &local_150.vector_;
  }
  pcVar8 = &local_150.iterator_;
  pcVar7 = pcVar8;
  if (local_150.reverse_ != false) {
    pcVar7 = &local_150.reverse_iterator_.current;
  }
  if (((__normal_iterator<const_cfd::core::ScriptElement_*,_std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>_>
        *)&pcVar7->_M_current)->_M_current !=
      (pvVar5->
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>).
      _M_impl.super__Vector_impl_data._M_start) {
    do {
      IteratorWrapper<cfd::core::ScriptElement>::next((ScriptElement *)local_c0,&local_150);
      uVar4 = local_c0._24_4_;
      uVar1 = ScriptOperator::OP_CHECKMULTISIGVERIFY._8_4_;
      if (local_c0._8_4_ == kElementOpCode) {
        if (local_c0._24_4_ == ScriptOperator::OP_CHECKMULTISIG._8_4_) {
          ScriptElement::~ScriptElement((ScriptElement *)local_c0);
          break;
        }
        ScriptElement::~ScriptElement((ScriptElement *)local_c0);
        if (uVar4 == uVar1) break;
      }
      else {
        ScriptElement::~ScriptElement((ScriptElement *)local_c0);
      }
      pvVar5 = pvVar9;
      if (local_150.reverse_ != false) {
        pvVar5 = &local_150.vector_;
      }
      pcVar7 = pcVar8;
      if (local_150.reverse_ != false) {
        pcVar7 = &local_150.reverse_iterator_.current;
      }
    } while (pcVar7->_M_current !=
             (pvVar5->
             super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
             )._M_impl.super__Vector_impl_data._M_start);
  }
  pvVar5 = pvVar9;
  if (local_150.reverse_ != false) {
    pvVar5 = &local_150.vector_;
  }
  pcVar7 = pcVar8;
  if (local_150.reverse_ != false) {
    pcVar7 = &local_150.reverse_iterator_.current;
  }
  if (pcVar7->_M_current ==
      (pvVar5->
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>).
      _M_impl.super__Vector_impl_data._M_start) {
    local_228._0_8_ = "cfdcore_script.cpp";
    local_228._8_4_ = 0x68c;
    local_228._16_8_ = "ExtractPubkeysFromMultisigScript";
    Script::ToString_abi_cxx11_((string *)local_c0,multisig_script);
    logger::log<std::__cxx11::string&>
              ((CfdSourceLocation *)local_228,kCfdLogLevelWarning,
               "Multisig opcode (OP_CHECKMULTISIG|VERIFY) not found in redeem script: script={}",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
    if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
      operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
    }
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    local_c0._0_8_ = local_c0 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_c0,
               "OP_CHCKMULTISIG(OP_CHECKMULTISIGVERIFY) not found in redeem script.","");
    CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)local_c0);
    __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
  }
  IteratorWrapper<cfd::core::ScriptElement>::next((ScriptElement *)local_c0,&local_150);
  if (((local_c0._8_4_ != kElementNumber) && (local_68 == 0)) && (local_c0._24_4_ != kOpFalse)) {
    local_1c8._0_8_ = "cfdcore_script.cpp";
    local_1c8._8_4_ = 0x69a;
    local_1c8._16_8_ = "ExtractPubkeysFromMultisigScript";
    Script::ToString_abi_cxx11_((string *)local_228,multisig_script);
    logger::log<std::__cxx11::string&>
              ((CfdSourceLocation *)local_1c8,kCfdLogLevelWarning,
               "Invalid OP_CHECKMULTISIG(VERIFY) input in redeem script. Missing contain pubkey number.: script={}"
               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228);
    if ((undefined1 *)local_228._0_8_ != local_228 + 0x10) {
      operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
    }
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    local_228._0_8_ = local_228 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_228,
               "Invalid OP_CHCKMULTISIG(OP_CHECKMULTISIGVERIFY) input in redeem script. Missing contain pubkey number."
               ,"");
    CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)local_228);
    __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_e8 = local_68;
  if (0 < local_68) {
    lVar10 = 0;
    local_f0 = local_68;
    do {
      pvVar5 = pvVar9;
      if (local_150.reverse_ != false) {
        pvVar5 = &local_150.vector_;
      }
      pcVar7 = pcVar8;
      if (local_150.reverse_ != false) {
        pcVar7 = &local_150.reverse_iterator_.current;
      }
      if (pcVar7->_M_current ==
          (pvVar5->
          super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>).
          _M_impl.super__Vector_impl_data._M_start) {
        local_1c8._0_8_ = "cfdcore_script.cpp";
        local_1c8._8_4_ = 0x6a9;
        local_1c8._16_8_ = "ExtractPubkeysFromMultisigScript";
        Script::ToString_abi_cxx11_((string *)local_228,multisig_script);
        logger::log<long&,std::__cxx11::string&>
                  ((CfdSourceLocation *)local_1c8,kCfdLogLevelWarning,
                   "Not found enough pubkeys in redeem script.: require_pubkey_num={}, script={}",
                   &local_e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228);
        if ((undefined1 *)local_228._0_8_ != local_228 + 0x10) {
          operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
        }
        pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
        local_228._0_8_ = local_228 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_228,"Not found enough pubkeys in redeem script.","");
        CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)local_228);
        __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
      }
      IteratorWrapper<cfd::core::ScriptElement>::next((ScriptElement *)local_228,&local_150);
      if (local_228._8_4_ != kElementBinary) {
        local_168.filename = "cfdcore_script.cpp";
        local_168.line = 0x6b6;
        local_168.funcname = "ExtractPubkeysFromMultisigScript";
        local_24c = local_228._8_4_;
        ScriptElement::ToString_abi_cxx11_((string *)local_1c8,(ScriptElement *)local_228);
        logger::log<cfd::core::ScriptElementType&,std::__cxx11::string&>
                  (&local_168,kCfdLogLevelWarning,
                   "Invalid script element. Not binary element.: ScriptElementType={}, data={}",
                   &local_24c,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8);
        if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
          operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
        }
        pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
        local_1c8._0_8_ = local_1c8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1c8,"Invalid ScriptElementType.(not binary)","");
        CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)local_1c8);
        __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
      }
      local_248.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_248.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_248.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar11 = (long)local_1e0 - (long)local_1e8;
      if (uVar11 == 0) {
        __dest = (pointer)0x0;
        __n = 0;
      }
      else {
        if ((long)uVar11 < 0) {
          ::std::__throw_bad_alloc();
        }
        __dest = (pointer)operator_new(uVar11);
        __n = (long)local_1e0 - (long)local_1e8;
      }
      local_248.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = __dest + uVar11;
      local_248.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = __dest;
      if (local_1e0 != local_1e8) {
        local_248.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = __dest;
        memmove(__dest,local_1e8,__n);
      }
      local_248.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = __dest + __n;
      Pubkey::Pubkey((Pubkey *)local_1c8,&local_248);
      ::std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::
      emplace_back<cfd::core::Pubkey>(__return_storage_ptr__,(Pubkey *)local_1c8);
      lVar3 = local_f0;
      if ((_func_int **)local_1c8._0_8_ != (_func_int **)0x0) {
        operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ - local_1c8._0_8_);
      }
      if (local_248.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_248.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_248.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_248.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      ScriptElement::~ScriptElement((ScriptElement *)local_228);
      lVar10 = lVar10 + 1;
    } while (lVar10 < lVar3);
  }
  local_1c8._0_4_ = 0xff;
  ScriptElement::ScriptElement((ScriptElement *)local_228,(ScriptType *)local_1c8);
  puVar2 = local_f8;
  if (local_150.reverse_ != false) {
    pvVar9 = &local_150.vector_;
  }
  if (local_150.reverse_ != false) {
    pcVar8 = &local_150.reverse_iterator_.current;
  }
  if (pcVar8->_M_current !=
      (pvVar9->
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>).
      _M_impl.super__Vector_impl_data._M_start) {
    IteratorWrapper<cfd::core::ScriptElement>::next((ScriptElement *)local_1c8,&local_150);
    ScriptElement::operator=((ScriptElement *)local_228,(ScriptElement *)local_1c8);
    ScriptElement::~ScriptElement((ScriptElement *)local_1c8);
  }
  if (((local_228._8_4_ == kElementNumber || local_1d0 != 0) && (local_228._8_4_ == kElementOpCode))
     && (0 < local_1d0)) {
    if (puVar2 != (uint32_t *)0x0) {
      *puVar2 = (uint32_t)local_1d0;
    }
    ::std::
    __reverse<__gnu_cxx::__normal_iterator<cfd::core::Pubkey*,std::vector<cfd::core::Pubkey,std::allocator<cfd::core::Pubkey>>>>
              ((__return_storage_ptr__->
               super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>)._M_impl.
               super__Vector_impl_data._M_start,
               (__return_storage_ptr__->
               super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    ScriptElement::~ScriptElement((ScriptElement *)local_228);
    ScriptElement::~ScriptElement((ScriptElement *)local_c0);
    IteratorWrapper<cfd::core::ScriptElement>::~IteratorWrapper(&local_150);
    ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
              (&local_48);
    return __return_storage_ptr__;
  }
  local_168.filename = "cfdcore_script.cpp";
  local_168.line = 0x6cb;
  local_168.funcname = "ExtractPubkeysFromMultisigScript";
  Script::ToString_abi_cxx11_((string *)local_1c8,multisig_script);
  logger::log<std::__cxx11::string&>
            (&local_168,kCfdLogLevelWarning,
             "Invalid OP_CHECKMULTISIG(VERIFY) input in redeem script. Missing require signature number.: script={}"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8);
  if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
    operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
  }
  pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
  local_1c8._0_8_ = local_1c8 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c8,
             "Invalid OP_CHCKMULTISIG(OP_CHECKMULTISIGVERIFY) input in redeem script. Missing require signature number."
             ,"");
  CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)local_1c8);
  __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

std::vector<Pubkey> ScriptUtil::ExtractPubkeysFromMultisigScript(
    const Script& multisig_script, uint32_t* require_num) {
  std::vector<Pubkey> pubkeys;
  const std::vector<ScriptElement> elements = multisig_script.GetElementList();

  // find OP_CHECKMULTISIG or OP_CHECKMULTISIGVERIFY
  IteratorWrapper<ScriptElement> itr = IteratorWrapper<ScriptElement>(
      elements, "Invalid script element access", true);
  // search OP_CHECKMULTISIG(or VERIFY)
  while (itr.hasNext()) {
    ScriptElement element = itr.next();
    if (!element.IsOpCode()) {
      continue;
    }
    if (element.GetOpCode() == ScriptOperator::OP_CHECKMULTISIG ||
        element.GetOpCode() == ScriptOperator::OP_CHECKMULTISIGVERIFY) {
      break;
    }
  }
  // target opcode not found
  if (!itr.hasNext()) {
    warn(
        CFD_LOG_SOURCE,
        "Multisig opcode (OP_CHECKMULTISIG|VERIFY) not found"
        " in redeem script: script={}",
        multisig_script.ToString());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "OP_CHCKMULTISIG(OP_CHECKMULTISIGVERIFY) not found"
        " in redeem script.");
  }

  // get contain pubkey num
  const ScriptElement& op_m = itr.next();
  if (!op_m.IsNumber()) {
    warn(
        CFD_LOG_SOURCE,
        "Invalid OP_CHECKMULTISIG(VERIFY) input in redeem script."
        " Missing contain pubkey number.: script={}",
        multisig_script.ToString());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Invalid OP_CHCKMULTISIG(OP_CHECKMULTISIGVERIFY) input"
        " in redeem script. Missing contain pubkey number.");
  }

  // set pubkey to vector(reverse data)
  int64_t contain_pubkey_num = op_m.GetNumber();
  for (int64_t i = 0; i < contain_pubkey_num; ++i) {
    if (!itr.hasNext()) {
      warn(
          CFD_LOG_SOURCE,
          "Not found enough pubkeys in redeem script.: "
          "require_pubkey_num={}, script={}",
          contain_pubkey_num, multisig_script.ToString());
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Not found enough pubkeys in redeem script.");
    }

    const ScriptElement& pubkey_element = itr.next();
    // check script element type
    if (!pubkey_element.IsBinary()) {
      warn(
          CFD_LOG_SOURCE,
          "Invalid script element. Not binary element.: "
          "ScriptElementType={}, data={}",
          pubkey_element.GetType(), pubkey_element.ToString());
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Invalid ScriptElementType.(not binary)");
    }

    // push pubkey data
    pubkeys.push_back(Pubkey(pubkey_element.GetBinaryData()));
  }

  // check opcode(require signature num)
  ScriptElement require_num_element(ScriptType::kOpInvalidOpCode);
  if (itr.hasNext()) {
    require_num_element = itr.next();
  }
  if (!(require_num_element.IsNumber() && require_num_element.IsOpCode()) ||
      (require_num_element.GetNumber() <= 0)) {
    warn(
        CFD_LOG_SOURCE,
        "Invalid OP_CHECKMULTISIG(VERIFY) input in redeem script."
        " Missing require signature number.: script={}",
        multisig_script.ToString());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Invalid OP_CHCKMULTISIG(OP_CHECKMULTISIGVERIFY) input"
        " in redeem script. Missing require signature number.");
  }

  if (require_num) {
    *require_num = static_cast<uint32_t>(require_num_element.GetNumber());
  }
  // return reverse pubkey vector
  std::reverse(std::begin(pubkeys), std::end(pubkeys));
  return pubkeys;
}